

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

Float __thiscall
pbrt::LightHandle::PDF_Li
          (LightHandle *this,LightSampleContext ctx,Vector3f wi,LightSamplingMode mode)

{
  uint uVar1;
  Float FVar2;
  undefined1 auVar3 [64];
  DispatchSplit<5> local_35;
  LightSamplingMode local_34;
  LightSampleContext *local_30;
  undefined8 *puStack_28;
  LightSamplingMode *local_20;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_18;
  undefined8 local_10;
  float local_8;
  
  local_8 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._8_56_ = wi._8_56_;
  auVar3._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_30 = &ctx;
  puStack_28 = &local_10;
  local_10 = vmovlps_avx(auVar3._0_16_);
  local_20 = &local_34;
  local_18.bits =
       (this->
       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
       ).bits;
  uVar1 = (uint)(ushort)(local_18.bits >> 0x30);
  local_34 = mode;
  if (local_18.bits >> 0x30 < 5) {
    FVar2 = 0.0;
    if (2 < uVar1) {
      if (uVar1 == 3) {
        FVar2 = ProjectionLight::PDF_Li
                          ((ProjectionLight *)(local_18.bits & 0xffffffffffff),ctx,wi,mode);
      }
      else {
        FVar2 = GoniometricLight::PDF_Li
                          ((GoniometricLight *)(local_18.bits & 0xffffffffffff),ctx,wi,mode);
      }
    }
  }
  else {
    FVar2 = detail::DispatchSplit<5>::operator()(&local_35,&local_18,uVar1 - 4);
  }
  return FVar2;
}

Assistant:

inline Float LightHandle::PDF_Li(LightSampleContext ctx, Vector3f wi,
                                 LightSamplingMode mode) const {
    auto pdf = [&](auto ptr) { return ptr->PDF_Li(ctx, wi, mode); };
    return Dispatch(pdf);
}